

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

IssuanceParameter * __thiscall
cfd::core::ConfidentialTransaction::SetAssetIssuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_in_index,Amount *asset_amount,Script *asset_locking_script,
          ConfidentialNonce *asset_nonce,Amount *token_amount,Script *token_locking_script,
          ConfidentialNonce *token_nonce,bool is_blind,ByteData256 *contract_hash)

{
  pointer *this_00;
  undefined1 local_d0 [8];
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  token_nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> token_locking_script_list;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> token_output_amount_list;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  asset_nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> asset_locking_script_list;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> asset_output_amount_list;
  bool is_blind_local;
  ConfidentialNonce *asset_nonce_local;
  Script *asset_locking_script_local;
  Amount *asset_amount_local;
  uint32_t tx_in_index_local;
  ConfidentialTransaction *this_local;
  
  this_00 = &asset_locking_script_list.
             super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)this_00);
  ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::vector
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &token_output_amount_list.
              super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_locking_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::vector
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             local_d0);
  ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)this_00,asset_amount);
  ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,asset_locking_script);
  ::std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            &token_output_amount_list.
             super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,asset_nonce);
  ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_locking_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,token_amount);
  ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,token_locking_script);
  ::std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            local_d0,token_nonce);
  SetAssetIssuance(__return_storage_ptr__,this,tx_in_index,asset_amount,
                   (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                   &asset_locking_script_list.
                    super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                   &asset_nonce_list.
                    super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                    *)&token_output_amount_list.
                       super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,token_amount,
                   (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                   &token_locking_script_list.
                    super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                   &token_nonce_list.
                    super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                    *)local_d0,is_blind,contract_hash);
  ::std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  ~vector((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
          local_d0);
  ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &token_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &token_locking_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  ~vector((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
          &token_output_amount_list.
           super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &asset_nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &asset_locking_script_list.
              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransaction::SetAssetIssuance(
    uint32_t tx_in_index, const Amount &asset_amount,
    const Script &asset_locking_script, const ConfidentialNonce &asset_nonce,
    const Amount &token_amount, const Script &token_locking_script,
    const ConfidentialNonce &token_nonce, bool is_blind,
    const ByteData256 &contract_hash) {
  std::vector<Amount> asset_output_amount_list;
  std::vector<Script> asset_locking_script_list;
  std::vector<ConfidentialNonce> asset_nonce_list;
  std::vector<Amount> token_output_amount_list;
  std::vector<Script> token_locking_script_list;
  std::vector<ConfidentialNonce> token_nonce_list;
  asset_output_amount_list.push_back(asset_amount);
  asset_locking_script_list.push_back(asset_locking_script);
  asset_nonce_list.push_back(asset_nonce);
  token_output_amount_list.push_back(token_amount);
  token_locking_script_list.push_back(token_locking_script);
  token_nonce_list.push_back(token_nonce);
  return SetAssetIssuance(
      tx_in_index, asset_amount, asset_output_amount_list,
      asset_locking_script_list, asset_nonce_list, token_amount,
      token_output_amount_list, token_locking_script_list, token_nonce_list,
      is_blind, contract_hash);
}